

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_2cc233::ValueSetter::~ValueSetter(ValueSetter *this)

{
  ~ValueSetter(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

~ValueSetter() override = default;